

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.h
# Opt level: O0

void tcg_gen_sub_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  uc_struct_conflict10 *uc_00;
  _Bool _Var1;
  bool bVar2;
  list_item *local_40;
  list_item *cur;
  hook *hook;
  uc_struct *uc;
  TCGv_i64 arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  uc_00 = tcg_ctx->uc;
  _Var1 = _hook_exists_bounded(uc_00->hook[0x10].head,tcg_ctx->pc_start);
  if (_Var1) {
    local_40 = uc_00->hook[0x10].head;
    while( true ) {
      bVar2 = false;
      if (local_40 != (list_item *)0x0) {
        cur = (list_item *)local_40->data;
        bVar2 = cur != (list_item *)0x0;
      }
      if (!bVar2) break;
      if (((((ulong)cur[1].next & 0x100000000) == 0) && (*(int *)((long)&cur->data + 4) == 0)) &&
         (*(int *)&cur[1].next == 0)) {
        gen_uc_traceopcode(tcg_ctx,cur,arg1,arg2,0x40,uc_00,tcg_ctx->pc_start);
      }
      local_40 = local_40->next;
    }
  }
  tcg_gen_op3_i64(tcg_ctx,INDEX_op_sub_i64,ret,arg1,arg2);
  return;
}

Assistant:

static inline void tcg_gen_sub_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, TCGv_i64 arg2)
{
    uc_engine *uc = tcg_ctx->uc;

    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_TCG_OPCODE, tcg_ctx->pc_start)) {
        struct hook *hook;
        HOOK_FOREACH_VAR_DECLARE;
        HOOK_FOREACH(uc, hook, UC_HOOK_TCG_OPCODE) {
            if (hook->to_delete)
                continue;
            if (hook->op == UC_TCG_OP_SUB && hook->op_flags == 0) {
                gen_uc_traceopcode(tcg_ctx, hook, arg1, arg2, 64, uc, tcg_ctx->pc_start);
            }
        }
    }

    tcg_gen_op3_i64(tcg_ctx, INDEX_op_sub_i64, ret, arg1, arg2);
}